

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_SetMergeOrder(Kf_Set_t *p,int *pCuts0,int *pCuts1,int fArea,int fCutMin)

{
  int *__s;
  Kf_Cut_t *pKVar1;
  int *piVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  Kf_Cut_t *pKVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  Kf_Cut_t *pKVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  Kf_Cut_t *pKVar21;
  Kf_Cut_t *pKVar22;
  Kf_Cut_t *pKVar23;
  bool bVar24;
  
  __s = p->pList;
  memset(__s,0xff,(ulong)p->nLutSize * 4 + 4);
  pKVar17 = p->pCuts0;
  iVar7 = Kf_SetLoadCuts(pKVar17,pCuts0);
  p->nCuts0 = iVar7;
  pKVar22 = p->pCuts1;
  iVar7 = Kf_SetLoadCuts(pKVar22,pCuts1);
  p->nCuts1 = iVar7;
  p->nCuts = 0;
  p->CutCount[0] = p->CutCount[0] + (long)iVar7 * (long)p->nCuts0;
  if (0 < p->nCuts0) {
    piVar8 = p->pCuts0[0].pLeaves;
    pKVar21 = pKVar17;
    do {
      if (0 < p->nCuts1) {
        uVar3 = p->nLutSize;
        piVar15 = p->pCuts1[0].pLeaves;
        pKVar23 = pKVar22;
        do {
          uVar4 = pKVar21->nLeaves;
          uVar12 = pKVar23->nLeaves;
          uVar11 = (uint)uVar3;
          if (((int)(uVar12 + uVar4) <= (int)(uint)uVar3) ||
             (uVar9 = pKVar23->Sign | pKVar21->Sign,
             uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555),
             uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333),
             (byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <=
             uVar11)) {
            p->CutCount[1] = p->CutCount[1] + 1;
            iVar7 = p->nCuts;
            pKVar1 = p->pCutsR + iVar7;
            if ((uVar4 == uVar11) && (uVar12 == uVar11)) {
              uVar12 = (uint)uVar3;
              if (0 < (int)uVar4) {
                uVar9 = 0;
                do {
                  if (piVar8[uVar9] != piVar15[uVar9]) goto LAB_0075f27b;
                  pKVar1->pLeaves[uVar9] = piVar8[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar4 != uVar9);
              }
LAB_0075f181:
              pKVar1->nLeaves = uVar12;
              p->CutCount[2] = p->CutCount[2] + 1;
              uVar9 = pKVar23->Sign | pKVar21->Sign;
              pKVar1->Sign = uVar9;
              uVar4 = pKVar1->nLeaves;
              iVar18 = p->pList[(int)uVar4];
              while (-1 < (long)iVar18) {
                pKVar10 = p->pCutsR + iVar18;
                if (pKVar10->Sign == uVar9) {
                  uVar12 = pKVar10->nLeaves;
                  if (uVar12 == uVar4) {
                    if ((int)uVar12 < 1) goto LAB_0075f27b;
                    uVar19 = 0;
                    while (pKVar10->pLeaves[uVar19] == pKVar1->pLeaves[uVar19]) {
                      uVar19 = uVar19 + 1;
                      if (uVar12 == uVar19) goto LAB_0075f27b;
                    }
                  }
                  else {
                    if ((int)uVar12 <= (int)uVar4) {
LAB_0075f42d:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                                    ,0x29f,"int Kf_SetCutIsContainedOrder(Kf_Cut_t *, Kf_Cut_t *)");
                    }
                    if (0 < (int)uVar12) {
                      uVar19 = 0;
                      uVar11 = 0;
                      do {
                        if (pKVar1->pLeaves[(int)uVar11] < pKVar10->pLeaves[uVar19]) break;
                        if ((pKVar10->pLeaves[uVar19] == pKVar1->pLeaves[(int)uVar11]) &&
                           (uVar11 = uVar11 + 1, uVar11 == uVar4)) goto LAB_0075f27b;
                        uVar19 = uVar19 + 1;
                      } while (uVar12 != uVar19);
                    }
                  }
                }
                iVar18 = pKVar10->iNext;
              }
              p->nCuts = p->nCuts + 1;
              if ((int)uVar4 < 2) {
                __assert_fail("pCutR->nLeaves > 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                              ,0x330,"void Kf_SetMergeOrder(Kf_Set_t *, int *, int *, int, int)");
              }
              iVar18 = pKVar23->Delay;
              if (pKVar23->Delay < pKVar21->Delay) {
                iVar18 = pKVar21->Delay;
              }
              pKVar1->Delay = iVar18;
              pKVar1->Area = pKVar21->Area + pKVar23->Area;
              pKVar1->iNext = __s[(int)uVar4];
              __s[(int)uVar4] = iVar7;
            }
            else if (uVar3 != 0) {
              lVar16 = 0;
              iVar14 = 0;
              iVar18 = 0;
LAB_0075f0bd:
              iVar13 = pKVar21->pLeaves[iVar18];
              iVar5 = pKVar23->pLeaves[iVar14];
              iVar6 = (int)lVar16;
              if (iVar13 < iVar5) {
                iVar18 = iVar18 + 1;
                pKVar1->pLeaves[lVar16] = iVar13;
                iVar13 = iVar14;
                if (iVar18 < (int)uVar4) goto LAB_0075f0fc;
LAB_0075f109:
                if ((int)(uVar12 + iVar6 + 1) <= (int)(iVar13 + (uint)uVar3)) {
                  if ((int)uVar12 <= iVar13) goto LAB_0075f17e;
                  lVar20 = (long)iVar13;
                  do {
                    piVar2 = piVar15 + lVar20;
                    lVar20 = lVar20 + 1;
                    p->pCutsR[iVar7].pLeaves[lVar16 + 1] = *piVar2;
                    lVar16 = lVar16 + 1;
                  } while ((int)uVar12 != lVar20);
LAB_0075f17a:
                  uVar12 = (int)lVar16 + 1;
                  goto LAB_0075f181;
                }
              }
              else {
                if (iVar5 < iVar13) {
                  pKVar1->pLeaves[lVar16] = iVar5;
                }
                else {
                  iVar18 = iVar18 + 1;
                  pKVar1->pLeaves[lVar16] = iVar13;
                  iVar13 = iVar14 + 1;
                  if ((int)uVar4 <= iVar18) goto LAB_0075f109;
                }
                iVar14 = iVar14 + 1;
                if (iVar14 < (int)uVar12) goto LAB_0075f0fc;
                if ((int)(uVar4 + iVar6 + 1) <= (int)(iVar18 + (uint)uVar3)) {
                  if (iVar18 < (int)uVar4) {
                    lVar20 = (long)iVar18;
                    do {
                      piVar2 = piVar8 + lVar20;
                      lVar20 = lVar20 + 1;
                      p->pCutsR[iVar7].pLeaves[lVar16 + 1] = *piVar2;
                      lVar16 = lVar16 + 1;
                    } while ((int)uVar4 != lVar20);
                    goto LAB_0075f17a;
                  }
LAB_0075f17e:
                  uVar12 = iVar6 + 1;
                  goto LAB_0075f181;
                }
              }
            }
          }
LAB_0075f27b:
          pKVar23 = pKVar23 + 1;
          piVar15 = piVar15 + 0x18;
        } while (pKVar23 < pKVar22 + p->nCuts1);
      }
      pKVar21 = pKVar21 + 1;
      piVar8 = piVar8 + 0x18;
    } while (pKVar21 < pKVar17 + p->nCuts0);
  }
  if (p->nCuts < 1) {
    __assert_fail("p->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                  ,0x2f0,"void Kf_SetFilterOrder(Kf_Set_t *)");
  }
  uVar3 = p->nLutSize;
  uVar9 = 0;
  do {
    lVar16 = (long)__s[uVar9];
    if (-1 < lVar16) {
      piVar8 = __s + uVar9;
      do {
        pKVar17 = p->pCutsR + lVar16;
        iVar7 = pKVar17->nLeaves;
        lVar16 = (long)iVar7;
        iVar18 = 0;
        if (0 < lVar16) {
LAB_0075f309:
          lVar20 = (long)__s[iVar18];
          if (-1 < lVar20) {
            do {
              pKVar22 = p->pCutsR + lVar20;
              if ((pKVar22->Sign & ~pKVar17->Sign) == 0) {
                iVar14 = pKVar22->nLeaves;
                if (iVar7 == iVar14) {
                  lVar20 = 0;
                  while (pKVar17->pLeaves[lVar20] == pKVar22->pLeaves[lVar20]) {
                    lVar20 = lVar20 + 1;
                    if (lVar16 == lVar20) goto LAB_0075f399;
                  }
                }
                else {
                  if (iVar7 <= iVar14) goto LAB_0075f42d;
                  lVar20 = 0;
                  iVar13 = 0;
                  do {
                    if (pKVar22->pLeaves[iVar13] < pKVar17->pLeaves[lVar20]) break;
                    if ((pKVar17->pLeaves[lVar20] == pKVar22->pLeaves[iVar13]) &&
                       (iVar13 = iVar13 + 1, iVar13 == iVar14)) goto LAB_0075f399;
                    lVar20 = lVar20 + 1;
                  } while (lVar16 != lVar20);
                }
              }
              lVar20 = (long)pKVar22->iNext;
            } while (-1 < lVar20);
          }
          goto LAB_0075f3a0;
        }
LAB_0075f3ac:
        piVar15 = &pKVar17->iNext;
        if (iVar18 == iVar7 + 1) {
          *piVar8 = *piVar15;
          piVar15 = piVar8;
        }
        lVar16 = (long)*piVar15;
        piVar8 = piVar15;
      } while (-1 < lVar16);
    }
    uVar19 = uVar9 + 1;
    bVar24 = uVar9 == uVar3;
    uVar9 = uVar19;
    if (bVar24) {
      iVar7 = p->nCuts;
      if (iVar7 < 1) {
        __assert_fail("p->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                      ,0x2fd,"void Kf_SetFilterOrder(Kf_Set_t *)");
      }
      iVar18 = p->nCutNum - 1;
      if (iVar7 < iVar18) {
        iVar18 = iVar7;
      }
      p->CutCount[3] = p->CutCount[3] + (long)iVar18;
      Kf_SetSelectBest(p,fArea,(int)uVar19);
      return;
    }
  } while( true );
LAB_0075f0fc:
  lVar16 = lVar16 + 1;
  if (uVar11 == (uint)lVar16) goto LAB_0075f27b;
  goto LAB_0075f0bd;
LAB_0075f399:
  p->nCuts = p->nCuts + -1;
  iVar18 = iVar7;
LAB_0075f3a0:
  iVar18 = iVar18 + 1;
  if (iVar7 <= iVar18) goto LAB_0075f3ac;
  goto LAB_0075f309;
}

Assistant:

static inline void Kf_SetMergeOrder( Kf_Set_t * p, int * pCuts0, int * pCuts1, int fArea, int fCutMin )
{
    Kf_Cut_t * pCut0, * pCut1, * pCutR;
    Kf_SetPrepare( p, pCuts0, pCuts1 );
    p->CutCount[0] += p->nCuts0 * p->nCuts1;
    for ( pCut0 = p->pCuts0; pCut0 < p->pCuts0 + p->nCuts0; pCut0++ )
    for ( pCut1 = p->pCuts1; pCut1 < p->pCuts1 + p->nCuts1; pCut1++ )
    {
        if ( pCut0->nLeaves + pCut1->nLeaves > p->nLutSize && Kf_SetCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
            continue;
        p->CutCount[1]++;        
        pCutR = p->pCutsR + p->nCuts;
        if ( !Kf_SetMergeOrderOne(pCut0, pCut1, pCutR, p->nLutSize) )
            continue;
        p->CutCount[2]++;        
        pCutR->Sign = pCut0->Sign | pCut1->Sign;
        if ( Kf_SetRemoveDuplicatesOrder(p, pCutR) )
            continue;
        p->nCuts++;
        if ( fCutMin )
        {
            int nOldSupp = pCutR->nLeaves;
//            pCutR->iFunc = Kf_SetComputeTruth( p, pCut0->iFunc, pCut1->iFunc, pCut0, pCut1, pCutR );
            assert( pCutR->nLeaves <= nOldSupp );
            if ( pCutR->nLeaves < nOldSupp )
                pCutR->Sign = Kf_SetCutGetSign( pCutR );
            // delay and area are inaccurate
        }
        assert( pCutR->nLeaves > 1 );
        pCutR->Delay = Abc_MaxInt(pCut0->Delay, pCut1->Delay);
        pCutR->Area  = pCut0->Area + pCut1->Area;
        // add new cut
        Kf_SetAddToList( p, pCutR, 0 );
    }
    Kf_SetFilterOrder( p );
//    Kf_CheckCuts( p );
    p->CutCount[3] += Abc_MinInt( p->nCuts, p->nCutNum-1 );
    Kf_SetSelectBest( p, fArea, 1 );
}